

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

ostream * absl::lts_20250127::operator<<(ostream *os,StatusCode code)

{
  ostream *poVar1;
  StatusCode in_EDX;
  undefined4 in_register_00000034;
  string local_30;
  
  StatusCodeToString_abi_cxx11_
            (&local_30,(lts_20250127 *)CONCAT44(in_register_00000034,code),in_EDX);
  poVar1 = std::operator<<(os,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, StatusCode code) {
  return os << StatusCodeToString(code);
}